

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr *o)

{
  bool bVar1;
  SQChar *pSVar2;
  int *in_RCX;
  SQWRITEFUNC in_RDX;
  HSQUIRRELVM in_RSI;
  SQVM *in_RDI;
  SQUnsignedInteger32 _type;
  SQInteger in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int iVar4;
  
  iVar4 = *in_RCX;
  bVar1 = SafeWrite(in_RSI,in_RDX,in_RCX,(SQUserPointer)CONCAT44(iVar4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
  if (!bVar1) {
    return false;
  }
  iVar3 = *in_RCX;
  if (iVar3 != 0x1000001) {
    if ((iVar3 == 0x1000008) || (iVar3 == 0x5000002)) {
      bVar1 = SafeWrite(in_RSI,in_RDX,in_RCX,(SQUserPointer)CONCAT44(iVar4,iVar3),
                        in_stack_ffffffffffffffc8);
      if (!bVar1) {
        return false;
      }
    }
    else if (iVar3 == 0x5000004) {
      bVar1 = SafeWrite(in_RSI,in_RDX,in_RCX,(SQUserPointer)CONCAT44(iVar4,0x5000004),
                        in_stack_ffffffffffffffc8);
      if (!bVar1) {
        return false;
      }
    }
    else {
      if (iVar3 != 0x8000010) {
        pSVar2 = GetTypeName((SQObjectPtr *)0x15e727);
        SQVM::Raise_Error(in_RDI,"cannot serialize a %s",pSVar2);
        return false;
      }
      bVar1 = SafeWrite(in_RSI,in_RDX,in_RCX,(SQUserPointer)CONCAT44(iVar4,0x8000010),
                        in_stack_ffffffffffffffc8);
      if (!bVar1) {
        return false;
      }
      bVar1 = SafeWrite(in_RSI,in_RDX,in_RCX,(SQUserPointer)CONCAT44(iVar4,iVar3),
                        in_stack_ffffffffffffffc8);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

static bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type = (SQUnsignedInteger32)sq_type(o);
    _CHECK_IO(SafeWrite(v,write,up,&_type,sizeof(_type)));
    switch(sq_type(o)){
    case OT_STRING:
        _CHECK_IO(SafeWrite(v,write,up,&_string(o)->_len,sizeof(SQInteger)));
        _CHECK_IO(SafeWrite(v,write,up,_stringval(o),_string(o)->_len));
        break;
    case OT_BOOL:
    case OT_INTEGER:
        _CHECK_IO(SafeWrite(v,write,up,&_integer(o),sizeof(SQInteger)));break;
    case OT_FLOAT:
        _CHECK_IO(SafeWrite(v,write,up,&_float(o),sizeof(SQFloat)));break;
    case OT_NULL:
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),GetTypeName(o));
        return false;
    }
    return true;
}